

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddNeg.c
# Opt level: O0

DdNode * cuddAddNegateRecur(DdManager *dd,DdNode *f)

{
  DdNode *f_00;
  DdManager *T_00;
  DdManager *E_00;
  DdManager *local_50;
  DdNode *E;
  DdNode *T;
  DdNode *fvn;
  DdNode *fv;
  DdNode *res;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    dd_local = (DdManager *)cuddUniqueConst(dd,-(double)(f->type).kids.T);
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1(dd,Cudd_addNegate,f);
    if (dd_local == (DdManager *)0x0) {
      f_00 = (f->type).kids.E;
      T_00 = (DdManager *)cuddAddNegateRecur(dd,(f->type).kids.T);
      if (T_00 == (DdManager *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
        E_00 = (DdManager *)cuddAddNegateRecur(dd,f_00);
        if (E_00 == (DdManager *)0x0) {
          Cudd_RecursiveDeref(dd,(DdNode *)T_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + 1;
          local_50 = T_00;
          if (T_00 != E_00) {
            local_50 = (DdManager *)cuddUniqueInter(dd,f->index,(DdNode *)T_00,(DdNode *)E_00);
          }
          if (local_50 == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,(DdNode *)T_00);
            Cudd_RecursiveDeref(dd,(DdNode *)E_00);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E_00 & 0xfffffffffffffffe) + 4) + -1;
            cuddCacheInsert1(dd,Cudd_addNegate,f,&local_50->sentinel);
            dd_local = local_50;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddAddNegateRecur(
  DdManager * dd,
  DdNode * f)
{
    DdNode *res,
            *fv, *fvn,
            *T, *E;

    statLine(dd);
    /* Check terminal cases. */
    if (cuddIsConstant(f)) {
        res = cuddUniqueConst(dd,-cuddV(f));
        return(res);
    }

    /* Check cache */
    res = cuddCacheLookup1(dd,Cudd_addNegate,f);
    if (res != NULL) return(res);

    /* Recursive Step */
    fv = cuddT(f);
    fvn = cuddE(f);
    T = cuddAddNegateRecur(dd,fv);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = cuddAddNegateRecur(dd,fvn);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);
    res = (T == E) ? T : cuddUniqueInter(dd,(int)f->index,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert1(dd,Cudd_addNegate,f,res);

    return(res);

}